

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O1

int NbIdenticalCar(char *track,char *searched_string,int size_max)

{
  ulong uVar1;
  char cVar2;
  char cVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  
  sVar4 = strlen(searched_string);
  if ((int)(uint)sVar4 < 1) {
    iVar6 = 0;
  }
  else {
    uVar5 = (ulong)((uint)sVar4 & 0x7fffffff);
    uVar8 = 0;
    iVar6 = 0;
    do {
      lVar9 = uVar5 - uVar8;
      if (0 < lVar9 && 0 < size_max) {
        bVar10 = true;
        uVar11 = 0;
        while (bVar10) {
          cVar2 = track[uVar11];
          cVar3 = searched_string[uVar11];
          uVar1 = uVar11 + 1;
          iVar7 = (int)uVar1;
          if ((long)uVar11 < (long)iVar6) {
            iVar7 = iVar6;
          }
          if (cVar3 + 0x20 != (int)cVar2 && (cVar2 + 0x20 != (int)cVar3 && cVar2 != cVar3)) {
            bVar10 = false;
            iVar7 = iVar6;
          }
          iVar6 = iVar7;
          if ((((long)size_max <= (long)uVar1) || (6 < uVar11)) ||
             (uVar11 = uVar1, lVar9 <= (long)uVar1)) break;
        }
      }
      uVar8 = uVar8 + 1;
      searched_string = searched_string + 1;
    } while (uVar8 != uVar5);
  }
  return iVar6;
}

Assistant:

int NbIdenticalCar(const char* track, const char* searched_string, int size_max)
{
   int i = 0;
   int lg_max = strlen(searched_string);
   int nb_car_found = 0;

   for (int j = 0; j < lg_max; j++)
   {
      bool correct = true;
      for (i = 0; i < size_max && i < 8 && i < lg_max - j && correct; i++)
      {
         if (track[i] != searched_string[j + i]
            && track[i] + 0x20 != searched_string[j + i]
            && track[i] != searched_string[j + i] + 0x20)
         {
            correct = false;
         }
         else
         {
            if (i >= nb_car_found) nb_car_found = i + 1;
         }
      }
   }

   return nb_car_found;
}